

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayoutPrivate::setupHfwLayoutData(QFormLayoutPrivate *this)

{
  QList<QLayoutStruct> *this_00;
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QFormLayout *this_01;
  QLayoutStruct *pQVar5;
  undefined8 *puVar6;
  QFormLayoutItem *pQVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  pointer pQVar15;
  pointer ppQVar16;
  QFormLayoutItem **ppQVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int r;
  ulong uVar21;
  long lVar22;
  
  this_01 = *(QFormLayout **)&(this->super_QLayoutPrivate).field_0x8;
  uVar19 = (ulong)(this->m_matrix).m_storage.d.size >> 1;
  this_00 = &this->hfwLayouts;
  QList<QLayoutStruct>::clear(this_00);
  QList<QLayoutStruct>::resize(this_00,(long)this->vLayoutCount);
  lVar18 = 0;
  for (lVar22 = 0; lVar22 < this->vLayoutCount; lVar22 = lVar22 + 1) {
    pQVar5 = (this->vLayouts).d.ptr;
    pQVar15 = QList<QLayoutStruct>::data(this_00);
    puVar6 = (undefined8 *)((long)&pQVar5->stretch + lVar18);
    uVar8 = puVar6[1];
    puVar1 = (undefined8 *)((long)&pQVar5->spacing + lVar18);
    uVar9 = *puVar1;
    uVar10 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pQVar15->stretch + lVar18);
    *puVar1 = *puVar6;
    puVar1[1] = uVar8;
    puVar6 = (undefined8 *)((long)&pQVar15->spacing + lVar18);
    *puVar6 = uVar9;
    puVar6[1] = uVar10;
    lVar18 = lVar18 + 0x20;
  }
  uVar21 = 0;
  uVar20 = uVar19 & 0xffffffff;
  if ((int)uVar19 < 1) {
    uVar20 = uVar21;
  }
  for (lVar18 = 0; uVar20 << 4 != lVar18; lVar18 = lVar18 + 0x10) {
    ppQVar16 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
    puVar6 = *(undefined8 **)((long)ppQVar16 + lVar18);
    r = (int)uVar21;
    ppQVar17 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()(&this->m_matrix,r,1);
    pQVar7 = *ppQVar17;
    bVar11 = QFormLayout::isRowVisible(this_01,r);
    if (bVar11) {
      if ((puVar6 != (undefined8 *)0x0) && (iVar14 = *(int *)(puVar6 + 6), -1 < (long)iVar14)) {
        if (*(char *)((long)puVar6 + 10) == '\x01') {
          iVar13 = (**(code **)(*(long *)*puVar6 + 0x50))
                             ((long *)*puVar6,*(undefined4 *)(puVar6 + 7));
          iVar14 = *(int *)(puVar6 + 6);
          pQVar15 = QList<QLayoutStruct>::data(this_00);
          pQVar15[iVar14].minimumSize = iVar13;
          iVar14 = *(int *)(puVar6 + 6);
          pQVar15 = QList<QLayoutStruct>::data(this_00);
          pQVar15[iVar14].sizeHint = iVar13;
        }
        else {
          iVar13 = *(int *)(puVar6 + 3);
          pQVar15 = QList<QLayoutStruct>::data(this_00);
          pQVar15[iVar14].sizeHint = iVar13;
          iVar14 = *(int *)(puVar6 + 2);
          iVar13 = *(int *)(puVar6 + 6);
          pQVar15 = QList<QLayoutStruct>::data(this_00);
          pQVar15[iVar13].minimumSize = iVar14;
        }
      }
      if ((pQVar7 != (QFormLayoutItem *)0x0) && (-1 < pQVar7->vLayoutIndex)) {
        bVar12 = pQVar7->isHfw;
        iVar14 = 0;
        if ((bool)bVar12 == true) {
          iVar14 = (*pQVar7->item->_vptr_QLayoutItem[10])
                             (pQVar7->item,(ulong)(uint)pQVar7->layoutWidth);
          bVar12 = pQVar7->isHfw;
        }
        iVar13 = iVar14;
        if ((bVar12 & 1) == 0) {
          iVar13 = (pQVar7->minSize).ht.m_i;
          iVar14 = (pQVar7->sizeHint).ht.m_i;
        }
        iVar2 = pQVar7->vLayoutIndex;
        if (pQVar7->sideBySide == true) {
          pQVar5 = (this->hfwLayouts).d.ptr;
          iVar3 = pQVar5[iVar2].sizeHint;
          iVar4 = pQVar5[iVar2].minimumSize;
          if (iVar3 < iVar14) {
            iVar3 = iVar14;
          }
          pQVar15 = QList<QLayoutStruct>::data(this_00);
          pQVar15[iVar2].sizeHint = iVar3;
          if (iVar13 <= iVar4) {
            iVar13 = iVar4;
          }
        }
        else {
          pQVar15 = QList<QLayoutStruct>::data(this_00);
          pQVar15[iVar2].sizeHint = iVar14;
        }
        iVar14 = pQVar7->vLayoutIndex;
        pQVar15 = QList<QLayoutStruct>::data(this_00);
        pQVar15[iVar14].minimumSize = iVar13;
      }
    }
    uVar21 = (ulong)(r + 1);
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setupHfwLayoutData()
{
    Q_Q(QFormLayout);
    // setupVerticalLayoutData must be called before this
    // setupHorizontalLayoutData must also be called before this
    // copies non hfw data into hfw
    // then updates size and min


    // Note: QGridLayout doesn't call minimumHeightForWidth,
    // but instead uses heightForWidth for both min and sizeHint.
    // For the common case where minimumHeightForWidth just calls
    // heightForWidth, we do the calculation twice, which can be
    // very expensive for word wrapped QLabels/QTextEdits, for example.
    // So we just use heightForWidth as well.
    int i;
    int rr = m_matrix.rowCount();

    hfwLayouts.clear();
    hfwLayouts.resize(vLayoutCount);
    for (i = 0; i < vLayoutCount; ++i)
        hfwLayouts[i] = vLayouts.at(i);

    for (i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // ignore rows with only hidden items
        if (!q->isRowVisible(i))
            continue;

        if (label && label->vLayoutIndex > -1) {
            if (label->isHfw) {
                // We don't check sideBySide here, since a label is only
                // ever side by side with its field
                int hfw = label->heightForWidth(label->layoutWidth);
                hfwLayouts[label->vLayoutIndex].minimumSize = hfw;
                hfwLayouts[label->vLayoutIndex].sizeHint = hfw;
            } else {
                // Reset these here, so the field can do a qMax below (the previous value may have
                // been the fields non-hfw values, which are often larger than hfw)
                hfwLayouts[label->vLayoutIndex].sizeHint = label->sizeHint.height();
                hfwLayouts[label->vLayoutIndex].minimumSize = label->minSize.height();
            }
        }

        if (field && field->vLayoutIndex > -1) {
            int hfw = field->isHfw ? field->heightForWidth(field->layoutWidth) : 0;
            int h = field->isHfw ? hfw : field->sizeHint.height();
            int mh = field->isHfw ? hfw : field->minSize.height();

            if (field->sideBySide) {
                int oh = hfwLayouts.at(field->vLayoutIndex).sizeHint;
                int omh = hfwLayouts.at(field->vLayoutIndex).minimumSize;

                hfwLayouts[field->vLayoutIndex].sizeHint = qMax(h, oh);
                hfwLayouts[field->vLayoutIndex].minimumSize = qMax(mh, omh);
            } else {
                hfwLayouts[field->vLayoutIndex].sizeHint = h;
                hfwLayouts[field->vLayoutIndex].minimumSize = mh;
            }
        }
    }
}